

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O3

AllTrueMatcher * Catch::Matchers::AllTrue(void)

{
  AllTrueMatcher *in_RDI;
  
  (in_RDI->super_MatcherGenericBase).super_MatcherUntypedBase.m_cachedToString.field_2.
  _M_allocated_capacity = 0;
  *(undefined8 *)
   ((long)&(in_RDI->super_MatcherGenericBase).super_MatcherUntypedBase.m_cachedToString.field_2 + 8)
       = 0;
  (in_RDI->super_MatcherGenericBase).super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)&(in_RDI->super_MatcherGenericBase).super_MatcherUntypedBase.m_cachedToString.
                 field_2;
  (in_RDI->super_MatcherGenericBase).super_MatcherUntypedBase.m_cachedToString._M_string_length = 0;
  (in_RDI->super_MatcherGenericBase).super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__MatcherGenericBase_00242b00;
  return in_RDI;
}

Assistant:

AllTrueMatcher AllTrue() { return AllTrueMatcher{}; }